

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall icu_63::PluralFormat::setLocale(PluralFormat *this,Locale *loc,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  Locale *loc_local;
  PluralFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    Locale::operator=(&this->locale,loc);
    MessagePattern::clear(&this->msgPattern);
    if (this->numberFormat != (NumberFormat *)0x0) {
      (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
    }
    this->offset = 0.0;
    this->numberFormat = (NumberFormat *)0x0;
    PluralSelectorAdapter::reset(&this->pluralRulesWrapper);
    init(this,(EVP_PKEY_CTX *)0x0);
  }
  return;
}

Assistant:

void
PluralFormat::setLocale(const Locale& loc, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    locale = loc;
    msgPattern.clear();
    delete numberFormat;
    offset = 0;
    numberFormat = NULL;
    pluralRulesWrapper.reset();
    init(NULL, UPLURAL_TYPE_CARDINAL, status);
}